

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O3

void anon_unknown.dwarf_7f28::GetCentroid
               (double *x,int x_length,int fs,double current_f0,int fft_size,double current_position
               ,ForwardRealFFT *forward_real_fft,double *centroid,RandnState *randn_state)

{
  ulong uVar1;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  ulong uVar5;
  double *unaff_RBX;
  long lVar6;
  ulong uVar7;
  fft_plan *pfVar8;
  fft_plan *pfVar9;
  undefined8 *puVar10;
  byte bVar11;
  double x_00;
  double *pdVar12;
  undefined8 auStackY_98 [5];
  undefined1 in_stack_ffffffffffffff90 [32];
  double __x;
  double *in_stack_ffffffffffffffc0;
  
  bVar11 = 0;
  pdVar12 = forward_real_fft->waveform;
  if (0 < fft_size) {
    memset(pdVar12,0,(ulong)(uint)fft_size << 3);
    in_stack_ffffffffffffffc0 = x;
  }
  GetWindowedWaveform(x,x_length,fs,current_f0,current_position,2,4.0,pdVar12,randn_state);
  x_00 = ((double)fs + (double)fs) / current_f0;
  iVar2 = matlab_round(x_00);
  if (iVar2 < 0) {
    __x = 0.0;
  }
  else {
    __x = 0.0;
    lVar6 = -1;
    do {
      __x = __x + forward_real_fft->waveform[lVar6 + 1] * forward_real_fft->waveform[lVar6 + 1];
      iVar2 = matlab_round(x_00);
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar2 * 2);
  }
  iVar2 = matlab_round(x_00);
  if (-1 < iVar2) {
    lVar6 = -1;
    pdVar12 = (double *)SQRT(__x);
    do {
      in_stack_ffffffffffffffc0 = pdVar12;
      if (__x < 0.0) {
        pdVar12 = (double *)sqrt(__x);
      }
      forward_real_fft->waveform[lVar6 + 1] =
           forward_real_fft->waveform[lVar6 + 1] / (double)pdVar12;
      iVar2 = matlab_round(x_00);
      lVar6 = lVar6 + 1;
      pdVar12 = in_stack_ffffffffffffffc0;
    } while (lVar6 < iVar2 * 2);
  }
  pfVar9 = &forward_real_fft->forward_fft;
  pfVar8 = pfVar9;
  puVar10 = auStackY_98;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar10 = *(undefined8 *)pfVar8;
    pfVar8 = (fft_plan *)((long)pfVar8 + (ulong)bVar11 * -0x10 + 8);
    puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
  }
  p.c_out = (fft_complex *)__x;
  p.n = in_stack_ffffffffffffff90._0_4_;
  p.sign = in_stack_ffffffffffffff90._4_4_;
  p.flags = in_stack_ffffffffffffff90._8_4_;
  p._12_4_ = in_stack_ffffffffffffff90._12_4_;
  p.c_in = (fft_complex *)in_stack_ffffffffffffff90._16_8_;
  p.in = (double *)in_stack_ffffffffffffff90._24_8_;
  p.out = (double *)x_00;
  p.input = in_stack_ffffffffffffffc0;
  p.ip = (int *)centroid;
  p.w = unaff_RBX;
  fft_execute(p);
  uVar5 = 0xffffffffffffffff;
  if (-4 < fft_size) {
    uVar5 = (long)(fft_size / 2) * 8 + 8;
  }
  pvVar3 = operator_new__(uVar5);
  pvVar4 = operator_new__(uVar5);
  if (fft_size < -1) {
    puVar10 = auStackY_98;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar10 = *(undefined8 *)pfVar9;
      pfVar9 = (fft_plan *)((long)pfVar9 + (ulong)bVar11 * -0x10 + 8);
      puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
    }
    p_00.c_out = (fft_complex *)__x;
    p_00.n = in_stack_ffffffffffffff90._0_4_;
    p_00.sign = in_stack_ffffffffffffff90._4_4_;
    p_00.flags = in_stack_ffffffffffffff90._8_4_;
    p_00._12_4_ = in_stack_ffffffffffffff90._12_4_;
    p_00.c_in = (fft_complex *)in_stack_ffffffffffffff90._16_8_;
    p_00.in = (double *)in_stack_ffffffffffffff90._24_8_;
    p_00.out = (double *)x_00;
    p_00.input = in_stack_ffffffffffffffc0;
    p_00.ip = (int *)centroid;
    p_00.w = unaff_RBX;
    fft_execute(p_00);
  }
  else {
    uVar7 = (ulong)(fft_size / 2 + 1);
    pdVar12 = *forward_real_fft->spectrum + 1;
    uVar5 = 0;
    do {
      *(double *)((long)pvVar3 + uVar5 * 8) = (*(fft_complex *)(pdVar12 + -1))[0];
      *(double *)((long)pvVar4 + uVar5 * 8) = *pdVar12;
      uVar5 = uVar5 + 1;
      pdVar12 = pdVar12 + 2;
    } while (uVar7 != uVar5);
    if (0 < fft_size) {
      pdVar12 = forward_real_fft->waveform;
      uVar5 = 0;
      do {
        uVar1 = uVar5 + 1;
        pdVar12[uVar5] = (double)(int)uVar1 * pdVar12[uVar5];
        uVar5 = uVar1;
      } while ((uint)fft_size != uVar1);
    }
    puVar10 = auStackY_98;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar10 = *(undefined8 *)pfVar9;
      pfVar9 = (fft_plan *)((long)pfVar9 + (ulong)bVar11 * -0x10 + 8);
      puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
    }
    p_01.c_out = (fft_complex *)__x;
    p_01.n = in_stack_ffffffffffffff90._0_4_;
    p_01.sign = in_stack_ffffffffffffff90._4_4_;
    p_01.flags = in_stack_ffffffffffffff90._8_4_;
    p_01._12_4_ = in_stack_ffffffffffffff90._12_4_;
    p_01.c_in = (fft_complex *)in_stack_ffffffffffffff90._16_8_;
    p_01.in = (double *)in_stack_ffffffffffffff90._24_8_;
    p_01.out = (double *)x_00;
    p_01.input = in_stack_ffffffffffffffc0;
    p_01.ip = (int *)centroid;
    p_01.w = unaff_RBX;
    fft_execute(p_01);
    if (-2 < fft_size) {
      pdVar12 = *forward_real_fft->spectrum + 1;
      uVar5 = 0;
      do {
        centroid[uVar5] =
             (*(fft_complex *)(pdVar12 + -1))[0] * *(double *)((long)pvVar3 + uVar5 * 8) +
             *(double *)((long)pvVar4 + uVar5 * 8) * *pdVar12;
        uVar5 = uVar5 + 1;
        pdVar12 = pdVar12 + 2;
      } while (uVar7 != uVar5);
    }
  }
  operator_delete__(pvVar3);
  operator_delete__(pvVar4);
  return;
}

Assistant:

static void GetCentroid(const double *x, int x_length, int fs,
    double current_f0, int fft_size, double current_position,
    const ForwardRealFFT *forward_real_fft, double *centroid,
    RandnState *randn_state) {
  for (int i = 0; i < fft_size; ++i) forward_real_fft->waveform[i] = 0.0;
  GetWindowedWaveform(x, x_length, fs, current_f0,
      current_position, world::kBlackman, 4.0, forward_real_fft->waveform, randn_state);
  double power = 0.0;
  for (int i = 0; i <= matlab_round(2.0 * fs / current_f0) * 2; ++i)
    power += forward_real_fft->waveform[i] * forward_real_fft->waveform[i];
  for (int i = 0; i <= matlab_round(2.0 * fs / current_f0) * 2; ++i)
    forward_real_fft->waveform[i] /= sqrt(power);

  fft_execute(forward_real_fft->forward_fft);
  double *tmp_real = new double[fft_size / 2 + 1];
  double *tmp_imag = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i) {
    tmp_real[i] = forward_real_fft->spectrum[i][0];
    tmp_imag[i] = forward_real_fft->spectrum[i][1];
  }

  for (int i = 0; i < fft_size; ++i)
    forward_real_fft->waveform[i] *= i + 1.0;
  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i)
    centroid[i] = forward_real_fft->spectrum[i][0] * tmp_real[i] +
      tmp_imag[i] * forward_real_fft->spectrum[i][1];

  delete[] tmp_real;
  delete[] tmp_imag;
}